

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O1

Vec_Wrd_t * Unm_ManComputeTruths(Unm_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  Vec_Wrd_t *vTruths;
  Vec_Int_t *pVVar6;
  word wVar7;
  long lVar8;
  int iVar9;
  Gia_Man_t *p_00;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  iVar12 = p->vUsed->nSize;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  if (iVar12 - 1U < 0xf) {
    iVar12 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar12;
  if (iVar12 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar12 << 3);
  }
  pVVar4->pArray = pwVar5;
  iVar12 = p->pGia->nObjs;
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar9 = iVar12;
  }
  vTruths->nSize = 0;
  vTruths->nCap = iVar9;
  if (iVar9 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar9 << 3);
  }
  vTruths->pArray = pwVar5;
  vTruths->nSize = iVar12;
  memset(pwVar5,0,(long)iVar12 << 3);
  pVVar6 = p->vUsed;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      iVar12 = pVVar6->pArray[lVar11];
      lVar10 = (long)iVar12;
      if ((lVar10 < 0) || (pVVar6 = p->pGia->vMapping, pVVar6->nSize <= iVar12)) {
LAB_0071660f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar6->pArray[lVar10] == 0) {
        __assert_fail("Gia_ObjIsLut(p->pGia, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                      ,0xe7,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
      }
      p->vLeaves->nSize = 0;
      p_00 = p->pGia;
      pVVar6 = p_00->vMapping;
      iVar9 = pVVar6->nSize;
      if (iVar9 <= iVar12) goto LAB_0071660f;
      lVar13 = 0;
      while( true ) {
        piVar3 = pVVar6->pArray;
        lVar8 = (long)piVar3[lVar10];
        if ((lVar8 < 0) || (iVar9 <= piVar3[lVar10])) goto LAB_0071660f;
        if (piVar3[lVar8] <= lVar13) break;
        Vec_IntPush(p->vLeaves,piVar3[lVar8 + lVar13 + 1]);
        lVar13 = lVar13 + 1;
        p_00 = p->pGia;
        pVVar6 = p_00->vMapping;
        iVar9 = pVVar6->nSize;
        if (iVar9 <= iVar12) goto LAB_0071660f;
      }
      if (6 < p->vLeaves->nSize) {
        __assert_fail("Vec_IntSize(p->vLeaves) <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                      ,0xec,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
      }
      if (p_00->nObjs <= iVar12) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      wVar7 = Shr_ManComputeTruth6(p_00,p_00->pObjs + lVar10,p->vLeaves,vTruths);
      uVar1 = pVVar4->nSize;
      uVar2 = pVVar4->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (word *)0x0) {
            pwVar5 = (word *)malloc(0x80);
          }
          else {
            pwVar5 = (word *)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = pwVar5;
          iVar12 = 0x10;
        }
        else {
          iVar12 = uVar2 * 2;
          if (iVar12 <= (int)uVar2) goto LAB_007165b9;
          if (pVVar4->pArray == (word *)0x0) {
            pwVar5 = (word *)malloc((ulong)uVar2 << 4);
          }
          else {
            pwVar5 = (word *)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
          }
          pVVar4->pArray = pwVar5;
        }
        if (pwVar5 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar4->nCap = iVar12;
      }
LAB_007165b9:
      pVVar4->nSize = uVar1 + 1;
      pVVar4->pArray[(int)uVar1] = wVar7;
      lVar11 = lVar11 + 1;
      pVVar6 = p->vUsed;
    } while (lVar11 < pVVar6->nSize);
  }
  if (vTruths->pArray != (word *)0x0) {
    free(vTruths->pArray);
    vTruths->pArray = (word *)0x0;
  }
  free(vTruths);
  return pVVar4;
}

Assistant:

Vec_Wrd_t * Unm_ManComputeTruths( Unm_Man_t * p )
{
    Vec_Wrd_t * vTruthsTemp, * vTruths;
    int i, k, iObj, iNode;
    word uTruth;
    vTruths = Vec_WrdAlloc( Vec_IntSize(p->vUsed) );
    vTruthsTemp = Vec_WrdStart( Gia_ManObjNum(p->pGia) );
    Vec_IntForEachEntry( p->vUsed, iObj, i )
    {
        assert( Gia_ObjIsLut(p->pGia, iObj) );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, iObj, iNode, k )
            Vec_IntPush( p->vLeaves, iNode );
        assert( Vec_IntSize(p->vLeaves) <= 6 );
        // compute truth table 
        uTruth = Shr_ManComputeTruth6( p->pGia, Gia_ManObj(p->pGia, iObj), p->vLeaves, vTruthsTemp );
        Vec_WrdPush( vTruths, uTruth );
//        if ( i % 100 == 0 )
//            Kit_DsdPrintFromTruth( (unsigned *)&uTruth, 6 ), printf( "\n" );
    }
    Vec_WrdFreeP( &vTruthsTemp );
    return vTruths;
}